

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_vector3.cxx
# Opt level: O0

uint16_t __thiscall xray_re::_vector3<float>::compress(_vector3<float> *this)

{
  float fVar1;
  double dVar2;
  ushort local_2c;
  int local_28;
  int v;
  int u;
  float adj;
  float _z;
  float _y;
  float _x;
  uint16_t s;
  _vector3<float> *this_local;
  
  if ((initialized & 1) == 0) {
    initialize();
  }
  _y._2_2_ = 0;
  _z = (this->field_0).field_0.x;
  if (_z < 0.0) {
    _z = -_z;
    _y._2_2_ = 0x8000;
  }
  adj = (this->field_0).field_0.y;
  if (adj < 0.0) {
    adj = -adj;
    _y._2_2_ = _y._2_2_ | 0x4000;
  }
  u = (int)(this->field_0).field_0.z;
  if ((float)u < 0.0) {
    u = (int)-(float)u;
    _y._2_2_ = _y._2_2_ | 0x2000;
  }
  fVar1 = 126.0 / (_z + adj + (float)u);
  dVar2 = std::floor((double)(ulong)(uint)(_z * fVar1));
  local_28 = (int)SUB84(dVar2,0);
  dVar2 = std::floor((double)(ulong)(uint)(adj * fVar1));
  local_2c = (ushort)(int)SUB84(dVar2,0);
  if (0x3f < local_28) {
    local_28 = 0x7f - local_28;
    local_2c = 0x7f - local_2c;
  }
  return (ushort)(local_28 << 7) | local_2c | _y._2_2_;
}

Assistant:

uint16_t _vector3<float>::compress() const
{
	if (!initialized)
		initialize();

	uint16_t s = 0;
	float _x, _y, _z;
	if ((_x = x) < 0) {
		_x = -_x;
		s |= 0x8000;
	}
	if ((_y = y) < 0) {
		_y = -_y;
		s |= 0x4000;
	}
	if ((_z = z) < 0) {
		_z = -_z;
		s |= 0x2000;
	}
	float adj = 126.f/(_x + _y + _z);
	int u = int(std::floor(_x * adj));
	int v = int(std::floor(_y * adj));
	if (u > 63) {
		u = 127 - u;
		v = 127 - v;
	}
	return (u << 7) | v | s;
}